

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphIterator.cpp
# Opt level: O2

bool __thiscall GlyphIterator::next(GlyphIterator *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t pixel;
  
  uVar1 = this->length;
  pixel = this->pixel + 1;
  this->pixel = pixel;
  if (pixel < uVar1) {
    this->xOffset = this->xOffset + 1;
    if (pixel % (uint)this->width == 0) {
      this->xOffset = (int)this->glyph->xOffset;
      this->yOffset = this->yOffset + 1;
    }
    bVar2 = getPixelValue(this,pixel);
    this->value = bVar2;
  }
  return pixel < uVar1;
}

Assistant:

bool GlyphIterator::next()
{
   this->pixel++;
   if (this->pixel >= this->length)
   {
      return 0; //end of glyph
   }

   //increment offsets
   this->xOffset++;
   if ((this->pixel % this->width) == 0) //wrap around?
   {
      this->xOffset = this->glyph->xOffset;
      this->yOffset++;
   }

   //get new pixel value
   this->value = getPixelValue(this->pixel);
   return 1;
}